

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O1

errr Term_save(void)

{
  uint8_t *puVar1;
  wchar_t w;
  wchar_t h;
  term *ptVar2;
  term_win *s;
  
  w = Term->wid;
  h = Term->hgt;
  s = (term_win *)mem_zalloc(0x60);
  term_win_init(s,w,h);
  term_win_copy(s,Term->scr,w,h);
  ptVar2 = Term;
  s->next = Term->mem;
  ptVar2->mem = s;
  puVar1 = &ptVar2->saved;
  *puVar1 = *puVar1 + '\x01';
  return 0;
}

Assistant:

errr Term_save(void)
{
	int w = Term->wid;
	int h = Term->hgt;

	term_win *mem;

	/* Allocate window */
	mem = mem_zalloc(sizeof(term_win));

	/* Initialize window */
	term_win_init(mem, w, h);

	/* Grab */
	term_win_copy(mem, Term->scr, w, h);

	/* Front of the queue */
	mem->next = Term->mem;
	Term->mem = mem;

	/* One more saved */
	Term->saved++;

	/* Success */
	return (0);
}